

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

optional_idx duckdb::FileSystem::GetAvailableDiskSpace(string *path)

{
  bool bVar1;
  int iVar2;
  idx_t available_disk_space;
  optional_idx local_80;
  statvfs vfs;
  
  iVar2 = statvfs((path->_M_dataplus)._M_p,(statvfs *)&vfs);
  if (iVar2 != -1) {
    available_disk_space = 0xffffffffffffffff;
    bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                      (vfs.f_frsize,vfs.f_bfree,&available_disk_space);
    if (bVar1) {
      optional_idx::optional_idx(&local_80,available_disk_space);
      return (optional_idx)local_80.index;
    }
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

static bool StartsWithSingleBackslash(const string &path) {
	if (path.size() < 2) {
		return false;
	}
	if (path[0] != '/' && path[0] != '\\') {
		return false;
	}
	if (path[1] == '/' || path[1] == '\\') {
		return false;
	}
	return true;
}